

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void TM4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  
  bVar1 = dst[-0x21];
  iVar3 = 0;
  puVar4 = dst;
  do {
    bVar2 = puVar4[-1];
    lVar5 = 0;
    do {
      puVar4[lVar5] = ""[(ulong)dst[lVar5 + -0x20] + (ulong)bVar2 + (0xff - (ulong)bVar1)];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    puVar4 = puVar4 + 0x20;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const uint8_t* const clip0 = VP8kclip1 - top[-1];
  int y;
  for (y = 0; y < size; ++y) {
    const uint8_t* const clip = clip0 + dst[-1];
    int x;
    for (x = 0; x < size; ++x) {
      dst[x] = clip[top[x]];
    }
    dst += BPS;
  }
}